

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic_bytes.cpp
# Opt level: O1

DataFileType duckdb::MagicBytes::CheckMagicBytes(FileSystem *fs,string *path)

{
  int iVar1;
  pointer this;
  DataFileType DVar2;
  undefined1 auVar3 [16];
  unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true> handle;
  char buffer [16];
  _Head_base<0UL,_duckdb::FileHandle_*,_false> local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  DVar2 = DUCKDB_FILE;
  if (path->_M_string_length != 0) {
    iVar1 = ::std::__cxx11::string::compare((char *)path);
    if (iVar1 != 0) {
      DVar2 = FILE_DOES_NOT_EXIST;
      (*fs->_vptr_FileSystem[2])(&local_40,fs,path,0x81,0x100,0);
      if (local_40._M_head_impl != (FileHandle *)0x0) {
        local_38 = 0;
        uStack_30 = 0;
        this = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
               operator->((unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>
                           *)&local_40);
        FileHandle::Read(this,&local_38,0x10);
        auVar3[0] = -((char)local_38 == 'S');
        auVar3[1] = -(local_38._1_1_ == 'Q');
        auVar3[2] = -(local_38._2_1_ == 'L');
        auVar3[3] = -(local_38._3_1_ == 'i');
        auVar3[4] = -(local_38._4_1_ == 't');
        auVar3[5] = -(local_38._5_1_ == 'e');
        auVar3[6] = -(local_38._6_1_ == ' ');
        auVar3[7] = -(local_38._7_1_ == 'f');
        auVar3[8] = -((char)uStack_30 == 'o');
        auVar3[9] = -(uStack_30._1_1_ == 'r');
        auVar3[10] = -(uStack_30._2_1_ == 'm');
        auVar3[0xb] = -(uStack_30._3_1_ == 'a');
        auVar3[0xc] = -(uStack_30._4_1_ == 't');
        auVar3[0xd] = -(uStack_30._5_1_ == ' ');
        auVar3[0xe] = -(uStack_30._6_1_ == '3');
        auVar3[0xf] = -(uStack_30._7_1_ == '\0');
        if ((ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar3 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar3 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar3 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar3 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar3 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar3 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar3 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar3[0xf] >> 7) << 0xf) == 0xffff) {
          DVar2 = SQLITE_FILE;
        }
        else {
          DVar2 = PARQUET_FILE;
          if ((int)local_38 != 0x31524150) {
            DVar2 = (int)uStack_30 == 0x4b435544;
          }
        }
      }
      if (local_40._M_head_impl != (FileHandle *)0x0) {
        (*(local_40._M_head_impl)->_vptr_FileHandle[1])();
      }
    }
  }
  return DVar2;
}

Assistant:

DataFileType MagicBytes::CheckMagicBytes(FileSystem &fs, const string &path) {
	if (path.empty() || path == IN_MEMORY_PATH) {
		return DataFileType::DUCKDB_FILE;
	}
	auto handle = fs.OpenFile(path, FileFlags::FILE_FLAGS_READ | FileFlags::FILE_FLAGS_NULL_IF_NOT_EXISTS);
	if (!handle) {
		return DataFileType::FILE_DOES_NOT_EXIST;
	}

	constexpr const idx_t MAGIC_BYTES_READ_SIZE = 16;
	char buffer[MAGIC_BYTES_READ_SIZE] = {};

	handle->Read(buffer, MAGIC_BYTES_READ_SIZE);
	if (memcmp(buffer, "SQLite format 3\0", 16) == 0) {
		return DataFileType::SQLITE_FILE;
	}
	if (memcmp(buffer, "PAR1", 4) == 0) {
		return DataFileType::PARQUET_FILE;
	}
	if (memcmp(buffer + MainHeader::MAGIC_BYTE_OFFSET, MainHeader::MAGIC_BYTES, MainHeader::MAGIC_BYTE_SIZE) == 0) {
		return DataFileType::DUCKDB_FILE;
	}
	return DataFileType::FILE_DOES_NOT_EXIST;
}